

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::
StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
          *this,time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *time_point)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string local_38;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)this;
  StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void>::convert_abi_cxx11_
            (&local_38,
             (StringMaker<std::chrono::duration<long,std::ratio<1l,1000000000l>>,void> *)&local_18,
             &time_point->__d);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::time_point<Clock, Duration> const& time_point) {
            return ::Catch::Detail::stringify(time_point.time_since_epoch()) + " since epoch";
        }